

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::ColumnMetaData::printTo(ColumnMetaData *this,ostream *out)

{
  ostream *poVar1;
  type *val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *t;
  type *val_00;
  string local_40;
  
  std::operator<<(out,"ColumnMetaData(");
  poVar1 = std::operator<<(out,"type=");
  to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->type,val);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"encodings=");
  duckdb_apache::thrift::to_string<duckdb_parquet::Encoding::type>(&local_40,&this->encodings);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"path_in_schema=");
  duckdb_apache::thrift::to_string<std::__cxx11::string>
            (&local_40,(thrift *)&this->path_in_schema,t);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"codec=");
  to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->codec,val_00);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"num_values=");
  duckdb_apache::thrift::to_string<long>(&local_40,&this->num_values);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"total_uncompressed_size=");
  duckdb_apache::thrift::to_string<long>(&local_40,&this->total_uncompressed_size);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"total_compressed_size=");
  duckdb_apache::thrift::to_string<long>(&local_40,&this->total_compressed_size);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"key_value_metadata=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::KeyValue>(&local_40,&this->key_value_metadata);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"data_page_offset=");
  duckdb_apache::thrift::to_string<long>(&local_40,&this->data_page_offset);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"index_page_offset=");
  if (((byte)this->__isset & 2) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<long>(&local_40,&this->index_page_offset);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"dictionary_page_offset=");
  if (((byte)this->__isset & 4) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<long>(&local_40,&this->dictionary_page_offset);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"statistics=");
  if (((byte)this->__isset & 8) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::Statistics>(&local_40,&this->statistics);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"encoding_stats=");
  if (((byte)this->__isset & 0x10) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::PageEncodingStats>
              (&local_40,&this->encoding_stats);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"bloom_filter_offset=");
  if (((byte)this->__isset & 0x20) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<long>(&local_40,&this->bloom_filter_offset);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"bloom_filter_length=");
  if (((byte)this->__isset & 0x40) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<int>(&local_40,&this->bloom_filter_length);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"size_statistics=");
  if ((char)this->__isset < '\0') {
    duckdb_apache::thrift::to_string<duckdb_parquet::SizeStatistics>
              (&local_40,&this->size_statistics);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::operator<<(out,"<null>");
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void ColumnMetaData::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "ColumnMetaData(";
  out << "type=" << to_string(type);
  out << ", " << "encodings=" << to_string(encodings);
  out << ", " << "path_in_schema=" << to_string(path_in_schema);
  out << ", " << "codec=" << to_string(codec);
  out << ", " << "num_values=" << to_string(num_values);
  out << ", " << "total_uncompressed_size=" << to_string(total_uncompressed_size);
  out << ", " << "total_compressed_size=" << to_string(total_compressed_size);
  out << ", " << "key_value_metadata="; (__isset.key_value_metadata ? (out << to_string(key_value_metadata)) : (out << "<null>"));
  out << ", " << "data_page_offset=" << to_string(data_page_offset);
  out << ", " << "index_page_offset="; (__isset.index_page_offset ? (out << to_string(index_page_offset)) : (out << "<null>"));
  out << ", " << "dictionary_page_offset="; (__isset.dictionary_page_offset ? (out << to_string(dictionary_page_offset)) : (out << "<null>"));
  out << ", " << "statistics="; (__isset.statistics ? (out << to_string(statistics)) : (out << "<null>"));
  out << ", " << "encoding_stats="; (__isset.encoding_stats ? (out << to_string(encoding_stats)) : (out << "<null>"));
  out << ", " << "bloom_filter_offset="; (__isset.bloom_filter_offset ? (out << to_string(bloom_filter_offset)) : (out << "<null>"));
  out << ", " << "bloom_filter_length="; (__isset.bloom_filter_length ? (out << to_string(bloom_filter_length)) : (out << "<null>"));
  out << ", " << "size_statistics="; (__isset.size_statistics ? (out << to_string(size_statistics)) : (out << "<null>"));
  out << ")";
}